

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.cpp
# Opt level: O0

Matrix<double,__1,_3,_0,__1,_3> ear::hoa::load_points(void)

{
  double __x;
  Scalar *pSVar1;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  Matrix<double,_1,3,0,_1,3> *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  Matrix<double,__1,_3,_0,__1,_3> MVar6;
  double theta;
  double phi;
  size_t i;
  Matrix<double,__1,_3,_0,__1,_3> *points;
  
  i._7_1_ = 0;
  i._0_4_ = 3;
  Eigen::Matrix<double,-1,3,0,-1,3>::Matrix<unsigned_long,int>
            (in_RDI,&points_file::num_points,(int *)&i);
  IVar2 = extraout_RDX;
  for (phi = 0.0; (ulong)phi < 0x1450; phi = (double)((long)phi + 1)) {
    dVar5 = *(double *)(points_file::points + (long)phi * 0x10);
    __x = *(double *)(points_file::points + (long)phi * 0x10 + 8);
    dVar3 = sin(__x);
    dVar4 = cos(dVar5);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,
                        (Index)phi,0);
    *pSVar1 = dVar3 * dVar4;
    dVar3 = sin(__x);
    dVar5 = sin(dVar5);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,
                        (Index)phi,1);
    *pSVar1 = dVar3 * dVar5;
    dVar5 = cos(__x);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,
                        (Index)phi,2);
    *pSVar1 = dVar5;
    IVar2 = extraout_RDX_00;
  }
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows = IVar2;
  MVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)in_RDI;
  return (Matrix<double,__1,_3,_0,__1,_3>)
         MVar6.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage;
}

Assistant:

Eigen::Matrix<double, Eigen::Dynamic, 3> ear::hoa::load_points() {
  Eigen::Matrix<double, Eigen::Dynamic, 3> points(points_file::num_points, 3);

  for (size_t i = 0; i < points_file::num_points; i++) {
    double phi = points_file::points[i][0], theta = points_file::points[i][1];
    points(i, 0) = std::sin(theta) * std::cos(phi);
    points(i, 1) = std::sin(theta) * std::sin(phi);
    points(i, 2) = std::cos(theta);
  }

  return points;
}